

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O3

vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
* get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)0>,unsigned_short>
            (vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
             *__return_storage_ptr__,unsigned_short max)

{
  pointer *ppdVar1;
  iterator __position;
  ulong uVar2;
  uint uVar3;
  short sVar4;
  short sVar5;
  long lVar6;
  size_t j;
  ulong uVar7;
  int iVar8;
  undefined6 in_register_00000032;
  ulong uVar9;
  vector<char,_std::allocator<char>_> sieve;
  divider<unsigned_short,_(libdivide::Branching)0> local_44;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  uVar9 = CONCAT62(in_register_00000032,max) & 0xffffffff;
  local_44.div.denom.magic = CONCAT11(local_44.div.denom.magic._1_1_,1);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_40,uVar9 + 1,(value_type *)&local_44,&local_41);
  if (3 < max) {
    lVar6 = 2;
    uVar7 = 4;
    do {
      if (uVar7 <= uVar9 &&
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] != '\0') {
        do {
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = '\0';
          uVar7 = uVar7 + lVar6;
        } while (uVar7 <= uVar9);
      }
      lVar6 = lVar6 + 1;
      uVar7 = lVar6 * lVar6;
    } while (uVar7 < uVar9 || uVar7 - uVar9 == 0);
  }
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (1 < max) {
    uVar7 = 2;
    do {
      if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] != '\0') {
        uVar3 = (uint)uVar7;
        local_44.div.denom.more = (byte)LZCOUNT((ushort)uVar7) ^ 0xf;
        if ((uVar3 + 0xffff & uVar3) == 0) {
          local_44.div.denom.magic = 0;
        }
        else {
          uVar2 = (ulong)(uint)(0x10000 << local_44.div.denom.more) / (uVar7 & 0xffffffff);
          sVar5 = (short)uVar2;
          iVar8 = (int)uVar2 * uVar3;
          if ((iVar8 + uVar3 & 0xffff) >> local_44.div.denom.more != 0) {
            sVar4 = (short)iVar8;
            local_44.div.denom.more = local_44.div.denom.more | 0x40;
            sVar5 = (ushort)(0 < sVar4 || (ushort)uVar7 <= (ushort)(sVar4 * -2)) + sVar5 * 2;
          }
          local_44.div.denom.magic = sVar5 + 1;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>
          ::_M_realloc_insert<libdivide::divider<unsigned_short,(libdivide::Branching)0>>
                    ((vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>
                      *)__return_storage_ptr__,__position,&local_44);
        }
        else {
          ((__position._M_current)->div).denom.more = local_44.div.denom.more;
          ((__position._M_current)->div).denom.magic = local_44.div.denom.magic;
          ppdVar1 = &(__return_storage_ptr__->
                     super__Vector_base<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppdVar1 = *ppdVar1 + 1;
        }
      }
      lVar6 = (2 - uVar9) + uVar7;
      uVar7 = uVar7 + 1;
    } while (lVar6 != 2);
  }
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}